

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Common.cpp
# Opt level: O2

bool __thiscall psy::C::Parser::parseTypeName(Parser *this,TypeNameSyntax **typeName)

{
  bool bVar1;
  TypeNameSyntax *pTVar2;
  SpecifierListSyntax *specList;
  DeclarationSyntax *decl;
  SpecifierListSyntax *local_20;
  DeclarationSyntax *local_18;
  
  local_18 = (DeclarationSyntax *)0x0;
  local_20 = (SpecifierListSyntax *)0x0;
  bVar1 = parseSpecifierQualifierList(this,&local_18,&local_20);
  if (bVar1) {
    pTVar2 = makeNode<psy::C::TypeNameSyntax>(this);
    *typeName = pTVar2;
    pTVar2->specs_ = local_20;
    bVar1 = parseAbstractDeclarator(this,&(*typeName)->decltor_);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Parser::parseTypeName(TypeNameSyntax*& typeName)
{
    DBG_THIS_RULE();

    DeclarationSyntax* decl = nullptr;
    SpecifierListSyntax* specList = nullptr;
    if (!parseSpecifierQualifierList(decl, specList))
        return false;

    typeName = makeNode<TypeNameSyntax>();
    typeName->specs_ = specList;
    return parseAbstractDeclarator(typeName->decltor_);
}